

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress2.c
# Opt level: O0

Vec_Int_t * Abc_ObjDressClass(Vec_Ptr_t *vRes,Vec_Int_t *vClass2Num,int Class)

{
  int iVar1;
  Vec_Int_t *Entry;
  int ClassNumber;
  int Class_local;
  Vec_Int_t *vClass2Num_local;
  Vec_Ptr_t *vRes_local;
  
  if (Class < 1) {
    __assert_fail("Class > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDress2.c"
                  ,0xb9,"Vec_Int_t *Abc_ObjDressClass(Vec_Ptr_t *, Vec_Int_t *, int)");
  }
  iVar1 = Vec_IntEntry(vClass2Num,Class);
  if (iVar1 != 0) {
    if (iVar1 < 1) {
      iVar1 = Vec_PtrSize(vRes);
      Vec_IntWriteEntry(vClass2Num,Class,iVar1);
      Entry = Vec_IntAlloc(4);
      Vec_PtrPush(vRes,Entry);
      vRes_local = (Vec_Ptr_t *)Vec_PtrEntryLast(vRes);
    }
    else {
      vRes_local = (Vec_Ptr_t *)Vec_PtrEntry(vRes,iVar1);
    }
    return (Vec_Int_t *)vRes_local;
  }
  __assert_fail("ClassNumber != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDress2.c"
                ,0xbb,"Vec_Int_t *Abc_ObjDressClass(Vec_Ptr_t *, Vec_Int_t *, int)");
}

Assistant:

Vec_Int_t * Abc_ObjDressClass( Vec_Ptr_t * vRes, Vec_Int_t * vClass2Num, int Class )
{
    int ClassNumber;
    assert( Class > 0 );
    ClassNumber = Vec_IntEntry( vClass2Num, Class );
    assert( ClassNumber != 0 );
    if ( ClassNumber > 0 )
        return (Vec_Int_t *)Vec_PtrEntry( vRes, ClassNumber ); // previous class
    // create new class
    Vec_IntWriteEntry( vClass2Num, Class, Vec_PtrSize(vRes) );
    Vec_PtrPush( vRes, Vec_IntAlloc(4) );
    return (Vec_Int_t *)Vec_PtrEntryLast( vRes ); 
}